

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QTtfGlyph>::emplace<QTtfGlyph_const&>
          (QMovableArrayOps<QTtfGlyph> *this,qsizetype i,QTtfGlyph *args)

{
  QTtfGlyph **ppQVar1;
  qsizetype *pqVar2;
  QTtfGlyph *pQVar3;
  quint16 qVar4;
  long lVar5;
  Data *pDVar6;
  QTtfGlyph *pQVar7;
  Data *pDVar8;
  char *pcVar9;
  qsizetype qVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  qint16 qVar13;
  qint16 qVar14;
  qint16 qVar15;
  qint16 qVar16;
  qint16 qVar17;
  quint16 qVar18;
  long in_FS_OFFSET;
  bool bVar19;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004b0c5f:
    qVar4 = args->numPoints;
    uVar11._0_2_ = args->index;
    uVar11._2_2_ = args->xMin;
    uVar11._4_2_ = args->xMax;
    uVar11._6_2_ = args->yMin;
    uVar12._0_2_ = args->yMax;
    uVar12._2_2_ = args->advanceWidth;
    uVar12._4_2_ = args->lsb;
    uVar12._6_2_ = args->numContours;
    pDVar8 = (args->data).d.d;
    pcVar9 = (args->data).d.ptr;
    qVar10 = (args->data).d.size;
    if (pDVar8 != (Data *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar19 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size != 0;
    QArrayDataPointer<QTtfGlyph>::detachAndGrow
              ((QArrayDataPointer<QTtfGlyph> *)this,(uint)(i == 0 && bVar19),1,(QTtfGlyph **)0x0,
               (QArrayDataPointer<QTtfGlyph> *)0x0);
    pQVar7 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr;
    local_58 = (undefined4)uVar11;
    uStack_50 = (undefined4)uVar12;
    if (i != 0 || !bVar19) {
      pQVar3 = pQVar7 + i;
      memmove(pQVar3 + 1,pQVar7 + i,
              ((this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size - i
              ) * 0x30);
      pQVar3->index = (undefined2)local_58;
      pQVar3->xMin = local_58._2_2_;
      pQVar3->xMax = uVar11._4_2_;
      pQVar3->yMin = uVar11._6_2_;
      pQVar3->yMax = (undefined2)uStack_50;
      pQVar3->advanceWidth = uStack_50._2_2_;
      pQVar3->lsb = uVar12._4_2_;
      pQVar3->numContours = uVar12._6_2_;
      pQVar3->numPoints = qVar4;
      (pQVar3->data).d.d = pDVar8;
      (pQVar3->data).d.ptr = pcVar9;
      (pQVar3->data).d.size = qVar10;
      goto LAB_004b0d36;
    }
    pQVar7[-1].numPoints = qVar4;
    pQVar7[-1].index = (undefined2)local_58;
    pQVar7[-1].xMin = local_58._2_2_;
    pQVar7[-1].xMax = uVar11._4_2_;
    pQVar7[-1].yMin = uVar11._6_2_;
    pQVar7[-1].yMax = (undefined2)uStack_50;
    pQVar7[-1].advanceWidth = uStack_50._2_2_;
    pQVar7[-1].lsb = uVar12._4_2_;
    pQVar7[-1].numContours = uVar12._6_2_;
    pQVar7[-1].data.d.d = pDVar8;
    pQVar7[-1].data.d.ptr = pcVar9;
    pQVar7[-1].data.d.size = qVar10;
  }
  else {
    if (((this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size == i) &&
       (pQVar7 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr,
       (pDVar6->super_QArrayData).alloc - i !=
       ((long)((long)pQVar7 -
              ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pQVar7[i].numPoints = args->numPoints;
      qVar13 = args->xMin;
      qVar14 = args->xMax;
      qVar15 = args->yMin;
      qVar16 = args->yMax;
      qVar4 = args->advanceWidth;
      qVar17 = args->lsb;
      qVar18 = args->numContours;
      pQVar3 = pQVar7 + i;
      pQVar3->index = args->index;
      pQVar3->xMin = qVar13;
      pQVar3->xMax = qVar14;
      pQVar3->yMin = qVar15;
      pQVar3->yMax = qVar16;
      pQVar3->advanceWidth = qVar4;
      pQVar3->lsb = qVar17;
      pQVar3->numContours = qVar18;
      pDVar8 = (args->data).d.d;
      pQVar7[i].data.d.d = pDVar8;
      pQVar7[i].data.d.ptr = (args->data).d.ptr;
      pQVar7[i].data.d.size = (args->data).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_004b0d36;
    }
    if ((i != 0) ||
       (pQVar7 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr,
       (QTtfGlyph *)((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pQVar7)) goto LAB_004b0c5f;
    pQVar7[-1].numPoints = args->numPoints;
    qVar13 = args->xMin;
    qVar14 = args->xMax;
    qVar15 = args->yMin;
    qVar16 = args->yMax;
    qVar4 = args->advanceWidth;
    qVar17 = args->lsb;
    qVar18 = args->numContours;
    pQVar7[-1].index = args->index;
    pQVar7[-1].xMin = qVar13;
    pQVar7[-1].xMax = qVar14;
    pQVar7[-1].yMin = qVar15;
    pQVar7[-1].yMax = qVar16;
    pQVar7[-1].advanceWidth = qVar4;
    pQVar7[-1].lsb = qVar17;
    pQVar7[-1].numContours = qVar18;
    pDVar8 = (args->data).d.d;
    pQVar7[-1].data.d.d = pDVar8;
    pQVar7[-1].data.d.ptr = (args->data).d.ptr;
    pQVar7[-1].data.d.size = (args->data).d.size;
    if (pDVar8 != (Data *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_004b0d36:
  pqVar2 = &(this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }